

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_> *
libcellml::unitsUsed
          (vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           *__return_storage_ptr__,ModelPtr *model,ComponentConstPtr *component)

{
  string *__return_storage_ptr___00;
  element_type *peVar1;
  string *name;
  bool bVar2;
  size_t sVar3;
  ComponentConstPtr *component_00;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unitsName;
  Model *pMVar5;
  _Alloc_hider name_00;
  UnitsPtr u;
  VariablePtr v;
  UnitsPtr modelUnits;
  NameList componentCnUnitsNames;
  UnitsPtr availableUnits;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  undefined1 local_70 [16];
  string local_60;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  __return_storage_ptr___00 = (string *)(local_70 + 0x10);
  do {
    sVar3 = Component::variableCount
                      ((component->
                       super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    if (sVar3 <= uVar4) {
      findComponentCnUnitsNames_abi_cxx11_
                ((NameList *)(local_70 + 0x10),(libcellml *)component,component_00);
      for (name_00._M_p = local_60._M_dataplus._M_p;
          name_00._M_p != (pointer)local_60._M_string_length; name_00._M_p = name_00._M_p + 0x20) {
        Model::units((Model *)local_98,
                     (string *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
        if ((element_type *)local_98._0_8_ == (element_type *)0x0) {
          Units::create((Units *)local_88,(string *)name_00._M_p);
          std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)local_98,
                     (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)local_88);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
        }
        else {
          referencedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                           *)local_88,model,(UnitsPtr *)local_98);
          std::
          vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,void>
                    ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                      *)__return_storage_ptr__,
                     (__return_storage_ptr__->
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                      )local_88._0_8_,
                     (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                      )local_88._8_8_);
          std::
          vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
          ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)local_88);
        }
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      }
      uVar4 = 0;
      while( true ) {
        sVar3 = ComponentEntity::componentCount
                          (&((component->
                             super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_ComponentEntity);
        if (sVar3 <= uVar4) break;
        ComponentEntity::component
                  ((ComponentEntity *)local_98,
                   (size_t)(component->
                           super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
        std::__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libcellml::Component,void>
                  ((__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2> *)local_70,
                   (__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)local_98);
        unitsUsed((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   *)local_88,model,(ComponentConstPtr *)local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
        std::
        vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,void>
                  ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                    *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                    )local_88._0_8_,
                   (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                    )local_88._8_8_);
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   *)local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
        uVar4 = uVar4 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_70 + 0x10));
      return __return_storage_ptr__;
    }
    Component::variable((Component *)local_88,
                        (size_t)(component->
                                super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    Variable::units((Variable *)local_98);
    if ((element_type *)local_98._0_8_ == (element_type *)0x0) {
LAB_0021326a:
      if ((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) {
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_98);
      }
    }
    else {
      NamedEntity::name_abi_cxx11_(__return_storage_ptr___00,(NamedEntity *)local_98._0_8_);
      bVar2 = isStandardUnitName(__return_storage_ptr___00);
      peVar1 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      if (bVar2 || peVar1 == (element_type *)0x0) goto LAB_0021326a;
      name = (string *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      NamedEntity::name_abi_cxx11_(__return_storage_ptr___00,(NamedEntity *)local_98._0_8_);
      Model::units((Model *)local_70,name);
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      pMVar5 = (Model *)local_70;
      if ((ImportedEntityImpl *)local_70._0_8_ == (ImportedEntityImpl *)0x0) {
        pMVar5 = (Model *)local_98;
      }
      std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)pMVar5);
      referencedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                       *)__return_storage_ptr___00,model,(UnitsPtr *)&local_40);
      std::
      vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,void>
                ((vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                  )local_60._M_dataplus._M_p,
                 (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                  )local_60._M_string_length);
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_40);
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                 *)__return_storage_ptr___00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::vector<UnitsPtr> unitsUsed(const ModelPtr &model, const ComponentConstPtr &component)
{
    std::vector<UnitsPtr> usedUnits;

    // Get all the units used by variables in this component.

    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto v = component->variable(i);
        auto u = v->units();
        if ((u != nullptr) && !isStandardUnitName(u->name()) && (model != nullptr)) {
            auto modelUnits = model->units(u->name());
            auto availableUnits = modelUnits ? modelUnits : u;
            auto requiredUnits = referencedUnits(model, availableUnits);
            usedUnits.insert(usedUnits.end(), requiredUnits.begin(), requiredUnits.end());
            usedUnits.push_back(availableUnits);
        } else if (model == nullptr) {
            usedUnits.push_back(u);
        }
    }

    // Get all the units used by cn elements in the components maths.

    auto componentCnUnitsNames = findComponentCnUnitsNames(component);
    for (const auto &unitsName : componentCnUnitsNames) {
        auto u = model->units(unitsName);
        if (u == nullptr) {
            // We have used a units in the math but it is not defined in the given model, so send back a units that isn't defined.
            u = Units::create(unitsName);
        } else {
            auto requiredUnits = referencedUnits(model, u);
            usedUnits.insert(usedUnits.end(), requiredUnits.begin(), requiredUnits.end());
        }
        usedUnits.push_back(u);
    }

    // Get all the units used by child components of this component.

    for (size_t i = 0; i < component->componentCount(); ++i) {
        auto childComponent = component->component(i);
        auto childUsedUnits = unitsUsed(model, childComponent);
        usedUnits.insert(usedUnits.end(), childUsedUnits.begin(), childUsedUnits.end());
    }

    return usedUnits;
}